

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Arg::parse(Arg *this,string *param_2,TokenStream *tokens)

{
  bool bVar1;
  Token *pTVar2;
  ParseState *value;
  long *in_RSI;
  BasicResult<Catch::clara::detail::ParseState> *in_RDI;
  ParserResult result;
  BoundValueRefBase *valueRef;
  Token *token;
  TokenStream remainingTokens;
  Result validationResult;
  ParseState *in_stack_fffffffffffffe88;
  ParseState *in_stack_fffffffffffffe90;
  BasicResult<Catch::clara::detail::ParseState> *this_00;
  TokenStream *in_stack_fffffffffffffeb0;
  BasicResult local_120 [48];
  ParseState *local_f0;
  int local_b8 [10];
  int *local_90;
  undefined4 local_60;
  BasicResult local_50 [80];
  
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0x10))(local_50);
  bVar1 = BasicResult::operator_cast_to_bool(local_50);
  if (bVar1) {
    TokenStream::TokenStream
              ((TokenStream *)in_stack_fffffffffffffe90,(TokenStream *)in_stack_fffffffffffffe88);
    TokenStream::operator*((TokenStream *)in_RDI);
    local_90 = local_b8;
    if (local_b8[0] == 1) {
      in_stack_fffffffffffffe90 =
           (ParseState *)
           std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2> *)
                      (in_RSI + 2));
      local_f0 = in_stack_fffffffffffffe90;
      pTVar2 = TokenStream::operator->((TokenStream *)0x174851);
      (*(*(_func_int ***)in_stack_fffffffffffffe90)[4])
                (local_120,in_stack_fffffffffffffe90,&pTVar2->token);
      bVar1 = BasicResult::operator_cast_to_bool(local_120);
      if (bVar1) {
        value = (ParseState *)TokenStream::operator++(in_stack_fffffffffffffeb0);
        ParseState::ParseState
                  (in_stack_fffffffffffffe90,(ParseResultType)((ulong)value >> 0x20),
                   (TokenStream *)0x1748d5);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>(value);
        ParseState::~ParseState((ParseState *)0x1748f2);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>
                  (this_00,(BasicResult<Catch::clara::detail::ParseResultType> *)in_RDI);
      }
      local_60 = 1;
      BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                ((BasicResult<Catch::clara::detail::ParseResultType> *)in_stack_fffffffffffffe90);
    }
    else {
      ParseState::ParseState
                (in_stack_fffffffffffffe90,
                 (ParseResultType)((ulong)in_stack_fffffffffffffe88 >> 0x20),(TokenStream *)0x174796
                );
      BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                (in_stack_fffffffffffffe88);
      ParseState::~ParseState((ParseState *)0x1747b9);
      local_60 = 1;
    }
    Token::~Token((Token *)0x174944);
    TokenStream::~TokenStream((TokenStream *)0x174951);
  }
  else {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (this_00,(BasicResult<void> *)in_RDI);
    local_60 = 1;
  }
  BasicResult<void>::~BasicResult((BasicResult<void> *)in_stack_fffffffffffffe90);
  return this_00;
}

Assistant:

auto parse( std::string const &, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            auto const &token = *remainingTokens;
            if( token.type != TokenType::Argument )
                return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );

            assert( !m_ref->isFlag() );
            auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );

            auto result = valueRef->setValue( remainingTokens->token );
            if( !result )
                return InternalParseResult( result );
            else
                return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
        }